

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void lws_context_destroy(lws_context *context)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  lws_foreign_thread_pollfd *plVar4;
  lws_vhost *plVar5;
  _func_int_lws_context_ptr *p_Var6;
  lws_foreign_thread_pollfd *ptr;
  bool bVar7;
  lws *plVar8;
  long lVar9;
  lws_vhost *vh;
  long lVar10;
  
  if (context == (lws_context *)0x0) {
    return;
  }
  uVar3 = *(ushort *)&context->field_0x510;
  if ((uVar3 & 2) != 0) {
    return;
  }
  *(ushort *)&context->field_0x510 = uVar3 | 2;
  if ((uVar3 >> 9 & 1) != 0) {
    p_Var6 = context->event_loop_ops->destroy_context2;
    if (p_Var6 != (_func_int_lws_context_ptr *)0x0) {
      (*p_Var6)(context);
    }
LAB_0010e03e:
    lws_context_destroy3(context);
    return;
  }
  if ((uVar3 & 8) == 0) {
    _lws_log(8,"%s: ctx %p\n","lws_context_destroy",context);
    context->field_0x510 = context->field_0x510 | 4;
    lws_state_transition(&context->mgr_system,0xb);
    if ((long)context->count_threads != 0) {
      bVar7 = false;
      lVar10 = (long)context->count_threads;
      do {
        lVar9 = lVar10 + -1;
        bVar2 = context->pt[lVar10 + -1].field_0x187;
        if ((bVar2 & 0x20) == 0) {
          if ((bVar2 & 2) == 0) {
            context->pt[lVar10 + -1].field_0x187 = bVar2 & 0xcd;
            ptr = context->pt[lVar10 + -1].foreign_pfd_list;
            while (ptr != (lws_foreign_thread_pollfd *)0x0) {
              plVar4 = ptr->next;
              lws_realloc(ptr,0,"lws_free");
              ptr = plVar4;
            }
            context->pt[lVar10 + -1].foreign_pfd_list = (lws_foreign_thread_pollfd *)0x0;
            plVar8 = context->pt[lVar10 + -1].pipe_wsi;
            if (plVar8 != (lws *)0x0) {
              lws_destroy_event_pipe(plVar8);
            }
            context->pt[lVar10 + -1].pipe_wsi = (lws *)0x0;
            while ((context->pt[lVar10 + -1].fds_count != 0 &&
                   (plVar8 = wsi_from_fd(context->pt[lVar10 + -1].context,
                                         (context->pt[lVar10 + -1].fds)->fd), plVar8 != (lws *)0x0))
                  ) {
              lws_close_free_wsi(plVar8,LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,"ctx destroy");
            }
            puVar1 = &context->pt[lVar10 + -1].field_0x187;
            *puVar1 = *puVar1 | 0x20;
            _lws_log(8,"%s: pt destroyed\n","lws_pt_destroy");
          }
          else {
            context->pt[lVar10 + -1].field_0x187 = bVar2 | 0x10;
            bVar7 = true;
          }
        }
        lVar10 = lVar9;
      } while (lVar9 != 0);
      if (bVar7) {
        _lws_log(8,"%s: waiting for deferred pt close\n","lws_context_destroy");
        lws_cancel_service(context);
        goto LAB_0010e0ae;
      }
    }
    uVar3 = *(ushort *)&context->field_0x510;
    *(ushort *)&context->field_0x510 = uVar3 | 0x28;
    if ((uVar3 & 0x40) == 0) {
      vh = (lws_vhost *)0x0;
    }
    else {
      vh = context->vhost_list;
    }
    while (vh != (lws_vhost *)0x0) {
      plVar5 = vh->vhost_next;
      lws_vhost_destroy1(vh);
      vh = plVar5;
    }
    lws_plat_context_early_destroy(context);
    p_Var6 = context->event_loop_ops->destroy_context1;
    if (p_Var6 != (_func_int_lws_context_ptr *)0x0) {
      (*p_Var6)(context);
LAB_0010e0ae:
      context->field_0x510 = context->field_0x510 & 0xfd;
      return;
    }
    context->field_0x510 = context->field_0x510 & 0xfd;
  }
  else if ((uVar3 & 0x10) != 0) {
    _lws_log(8,"%s: ctx %p: already being destroyed\n","lws_context_destroy",context);
    goto LAB_0010e03e;
  }
  lws_context_destroy2(context);
  return;
}

Assistant:

void
lws_context_destroy(struct lws_context *context)
{
#if defined(LWS_WITH_NETWORK)
	struct lws_vhost *vh = NULL;
	int m, deferred_pt = 0;
#endif

	if (!context || context->inside_context_destroy)
		return;

	context->inside_context_destroy = 1;

#if defined(LWS_WITH_NETWORK)
	if (context->finalize_destroy_after_internal_loops_stopped) {
		if (context->event_loop_ops->destroy_context2)
			context->event_loop_ops->destroy_context2(context);
		lws_context_destroy3(context);
		/* context is invalid, no need to reset inside flag */
		return;
	}
#endif
	if (context->being_destroyed1) {
		if (!context->being_destroyed2) {
			lws_context_destroy2(context);

			return;
		}
		lwsl_info("%s: ctx %p: already being destroyed\n",
			    __func__, context);

		lws_context_destroy3(context);
		/* context is invalid, no need to reset inside flag */
		return;
	}

	lwsl_info("%s: ctx %p\n", __func__, context);

	context->being_destroyed = 1;

#if defined(LWS_WITH_NETWORK)
	lws_state_transition(&context->mgr_system, LWS_SYSTATE_POLICY_INVALID);
	m = context->count_threads;

	while (m--) {
		struct lws_context_per_thread *pt = &context->pt[m];

		if (pt->is_destroyed)
			continue;

		if (pt->inside_lws_service) {
			pt->destroy_self = 1;
			deferred_pt = 1;
			continue;
		}

		lws_pt_destroy(pt);
	}

	if (deferred_pt) {
		lwsl_info("%s: waiting for deferred pt close\n", __func__);
		lws_cancel_service(context);
		goto out;
	}

	context->being_destroyed1 = 1;
	context->requested_kill = 1;

	/*
	 * inform all the protocols that they are done and will have no more
	 * callbacks.
	 *
	 * We can't free things until after the event loop shuts down.
	 */
	if (context->protocol_init_done)
		vh = context->vhost_list;
	while (vh) {
		struct lws_vhost *vhn = vh->vhost_next;
		lws_vhost_destroy1(vh);
		vh = vhn;
	}
#endif

	lws_plat_context_early_destroy(context);

#if defined(LWS_WITH_NETWORK)

	/*
	 * We face two different needs depending if foreign loop or not.
	 *
	 * 1) If foreign loop, we really want to advance the destroy_context()
	 *    past here, and block only for libuv-style async close completion.
	 *
	 * 2a) If poll, and we exited by ourselves and are calling a final
	 *     destroy_context() outside of any service already, we want to
	 *     advance all the way in one step.
	 *
	 * 2b) If poll, and we are reacting to a SIGINT, service thread(s) may
	 *     be in poll wait or servicing.  We can't advance the
	 *     destroy_context() to the point it's freeing things; we have to
	 *     leave that for the final destroy_context() after the service
	 *     thread(s) are finished calling for service.
	 */

	if (context->event_loop_ops->destroy_context1) {
		context->event_loop_ops->destroy_context1(context);

		goto out;
	}
#endif

#if defined(LWS_PLAT_FREERTOS)
#if defined(LWS_AMAZON_RTOS)
	context->last_free_heap = xPortGetFreeHeapSize();
#else
	context->last_free_heap = esp_get_free_heap_size();
#endif
#endif

	context->inside_context_destroy = 0;
	lws_context_destroy2(context);

	return;

#if defined(LWS_WITH_NETWORK)
out:
	context->inside_context_destroy = 0;
#endif
}